

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.h
# Opt level: O1

void __thiscall
YAML::EmitterState::_Set<unsigned_long>
          (EmitterState *this,Setting<unsigned_long> *fmt,unsigned_long value,value scope)

{
  pointer *__ptr;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> pChange_1;
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> pChange;
  __uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> local_28;
  __uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> local_20;
  
  if (scope == Global) {
    fmt->m_value = value;
    local_28._M_t.
    super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
    .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         (tuple<YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
         operator_new(0x18);
    *(undefined ***)
     local_28._M_t.
     super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
     .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         &PTR__SettingChangeBase_00889950;
    *(Setting<unsigned_long> **)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
            .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl + 8) = fmt;
    *(unsigned_long *)
     ((long)local_28._M_t.
            super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
            .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl + 0x10) =
         fmt->m_value;
    fmt->m_value = value;
    std::
    vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
    ::
    emplace_back<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>
              ((vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
                *)&this->m_globalModifiedSettings,
               (unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> *
               )&local_28);
    if ((_Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
        local_28._M_t.
        super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
        .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl !=
        (SettingChangeBase *)0x0) {
      (**(code **)(*(long *)local_28._M_t.
                            super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
                            .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl +
                  8))();
    }
  }
  else if (scope == Local) {
    local_20._M_t.
    super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
    .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         (tuple<YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
         operator_new(0x18);
    *(undefined ***)
     local_20._M_t.
     super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
     .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         &PTR__SettingChangeBase_00889950;
    *(Setting<unsigned_long> **)
     ((long)local_20._M_t.
            super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
            .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl + 8) = fmt;
    *(unsigned_long *)
     ((long)local_20._M_t.
            super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
            .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl + 0x10) =
         fmt->m_value;
    fmt->m_value = value;
    std::
    vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
    ::
    emplace_back<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>
              ((vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
                *)&this->m_modifiedSettings,
               (unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> *
               )&local_20);
    if ((_Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
        local_20._M_t.
        super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
        .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl !=
        (SettingChangeBase *)0x0) {
      (**(code **)(*(long *)local_20._M_t.
                            super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
                            .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl +
                  8))();
    }
  }
  return;
}

Assistant:

void EmitterState::_Set(Setting<T>& fmt, T value, FmtScope::value scope) {
  switch (scope) {
    case FmtScope::Local:
      m_modifiedSettings.push(fmt.set(value));
      break;
    case FmtScope::Global:
      fmt.set(value);
      m_globalModifiedSettings.push(
          fmt.set(value));  // this pushes an identity set, so when we restore,
      // it restores to the value here, and not the previous one
      break;
    default:
      assert(false);
  }
}